

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stun_msg.c
# Opt level: O0

int stun_msg_verify(stun_msg_hdr *msg_hdr,size_t msg_size)

{
  uint16_t uVar1;
  int iVar2;
  size_t sVar3;
  stun_msg_hdr *psVar4;
  stun_msg_hdr *psVar5;
  stun_attr_uint32 *fingerprint;
  stun_attr_hdr *attr_hdr;
  uint8_t *p_end;
  uint8_t *p;
  size_t msg_len;
  size_t msg_size_local;
  stun_msg_hdr *msg_hdr_local;
  
  if (((char)msg_hdr->type == '\0') || ((char)msg_hdr->type == '\x01')) {
    sVar3 = stun_msg_len(msg_hdr);
    if (msg_size < sVar3) {
      msg_hdr_local._4_4_ = 0;
    }
    else if ((sVar3 & 3) == 0) {
      psVar4 = (stun_msg_hdr *)(msg_hdr->tsx_id + (sVar3 - 8));
      psVar5 = msg_hdr + 1;
      if (msg_hdr + 1 == psVar4) {
        msg_hdr_local._4_4_ = 1;
      }
      else {
        do {
          p_end = (uint8_t *)psVar5;
          sVar3 = stun_attr_block_len((stun_attr_hdr *)p_end);
          psVar5 = (stun_msg_hdr *)(p_end + sVar3);
        } while (psVar5 < psVar4);
        if (psVar5 == psVar4) {
          uVar1 = ntohs(*(uint16_t *)p_end);
          if ((uVar1 == 0x8028) &&
             (iVar2 = stun_attr_fingerprint_check((stun_attr_uint32 *)p_end,msg_hdr), iVar2 == 0)) {
            msg_hdr_local._4_4_ = 0;
          }
          else {
            msg_hdr_local._4_4_ = 1;
          }
        }
        else {
          msg_hdr_local._4_4_ = 0;
        }
      }
    }
    else {
      msg_hdr_local._4_4_ = 0;
    }
  }
  else {
    msg_hdr_local._4_4_ = 0;
  }
  return msg_hdr_local._4_4_;
}

Assistant:

int stun_msg_verify(const stun_msg_hdr *msg_hdr, size_t msg_size) {
  size_t msg_len;
  const uint8_t *p = (const uint8_t*)msg_hdr;
  const uint8_t *p_end;
  const stun_attr_hdr *attr_hdr;

  /* First byte of STUN message is always 0x00 or 0x01. */
  if (*p != 0x00 && *p != 0x01)
    return 0;

  /* Check the length, it cannot exceed the message size. */
  msg_len = stun_msg_len(msg_hdr);
  if (msg_len > msg_size)
    return 0;

  /* STUN message is always padded to the nearest 4 bytes, thus
   * the last two bits of the length field are always zero.
   */
  if ((msg_len & 0x03) != 0)
    return 0;

  /* Check if the attribute lengths don't exceed the message length. */
  p_end = p + msg_len;
  p += sizeof(stun_msg_hdr);
  if (p == p_end)
    return 1; /* It's an empty message, nothing else to check */
  do {
    attr_hdr = (const stun_attr_hdr *)p;
    p += stun_attr_block_len(attr_hdr);
  } while (p < p_end);
  if (p != p_end)
    return 0;

  /* If FINGERPRINT is the last attribute, check if is valid */
  if (ntohs(attr_hdr->type) == STUN_ATTR_FINGERPRINT) {
    const stun_attr_uint32 *fingerprint =
        (const stun_attr_uint32 *)attr_hdr;
    if (!stun_attr_fingerprint_check(fingerprint, msg_hdr))
      return 0;
  }

  return 1; /* all is well */
}